

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

void anon_unknown.dwarf_132c4df::ParseError(string *message,Element *element)

{
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if (element == (Element *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&bStack_38,"FBX-Parser ",message);
    std::runtime_error::runtime_error(this,(string *)&bStack_38);
    *(undefined ***)this = &PTR__runtime_error_0080bf48;
    __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  ParseError(message,element->key_token);
}

Assistant:

AI_WONT_RETURN void ParseError(const std::string& message, const Element* element)
    {
        if(element) {
            ParseError(message,element->KeyToken());
        }
        throw DeadlyImportError("FBX-Parser " + message);
    }